

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O3

vector<Reading,_std::allocator<Reading>_> *
get_readings_from_file
          (vector<Reading,_std::allocator<Reading>_> *__return_storage_ptr__,string *file_name)

{
  pointer *ppRVar1;
  iterator __position;
  runtime_error *this;
  long *plVar2;
  char **ppcVar3;
  Reading r;
  ifstream ifs;
  undefined1 local_270 [16];
  char *local_260;
  long lStack_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230 [4];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(local_230,(string *)file_name,_S_in);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
    (__return_storage_ptr__->super__Vector_base<Reading,_std::allocator<Reading>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Reading,_std::allocator<Reading>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Reading,_std::allocator<Reading>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      operator>>((istream *)local_230,(Reading *)local_270);
      if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 7) != 0) break;
      if ((char)local_260 == 'f') {
        local_270._8_8_ = ((double)local_270._8_8_ + -32.0) / 1.8;
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<Reading,_std::allocator<Reading>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<Reading,_std::allocator<Reading>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Reading,std::allocator<Reading>>::_M_realloc_insert<Reading_const&>
                  ((vector<Reading,std::allocator<Reading>> *)__return_storage_ptr__,__position,
                   (Reading *)local_270);
      }
      else {
        *(char **)&(__position._M_current)->temp_unit = local_260;
        *(undefined8 *)__position._M_current = local_270._0_8_;
        (__position._M_current)->temp = (double)local_270._8_8_;
        ppRVar1 = &(__return_storage_ptr__->super__Vector_base<Reading,_std::allocator<Reading>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppRVar1 = *ppRVar1 + 1;
      }
      local_270._8_8_ = 4294967295.0;
      local_270._0_4_ = 0x19;
      local_260 = (char *)CONCAT71(local_260._1_7_,'k');
    }
    std::ifstream::~ifstream(local_230);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_250,"\'",file_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_270._0_8_ = *plVar2;
  ppcVar3 = (char **)(plVar2 + 2);
  if ((char **)local_270._0_8_ == ppcVar3) {
    local_260 = *ppcVar3;
    lStack_258 = plVar2[3];
    local_270._0_8_ = &local_260;
  }
  else {
    local_260 = *ppcVar3;
  }
  local_270._8_8_ = plVar2[1];
  *plVar2 = (long)ppcVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)local_270);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<Reading> get_readings_from_file(const std::string& file_name)
{
	static const auto invalid_temp{ UINT32_MAX };
	static const auto invalid_hour{ 25 };
	static const auto invalid_temp_unit{ 'k' };
	std::ifstream ifs{ file_name };
	if (!ifs)
	{
		throw std::runtime_error("'" + file_name + "' could not be opened for reading.");
	}
	std::vector<Reading> readings;
	Reading r;
	while (ifs >> r && !ifs.eof())
	{
		if (r.temp_unit == 'f')
		{
			r.temp = fahr_to_celc(r.temp);
		}
		readings.push_back(r);
		r.temp = invalid_temp;
		r.hour = invalid_hour;
		r.temp_unit = invalid_temp_unit;
	}
	return readings;
}